

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O2

bool anon_unknown.dwarf_1e4a68::matched(AffixPatternMatcher *affix,UnicodeString *patternString)

{
  UBool UVar1;
  bool bVar2;
  UnicodeString local_50;
  
  if (affix == (AffixPatternMatcher *)0x0) {
    bVar2 = (bool)(*(byte *)&patternString->fUnion & 1);
  }
  else {
    icu_63::numparse::impl::CompactUnicodeString<4>::toAliasedUnicodeString
              (&local_50,&affix->fPattern);
    UVar1 = icu_63::UnicodeString::operator==(&local_50,patternString);
    bVar2 = UVar1 != '\0';
    icu_63::UnicodeString::~UnicodeString(&local_50);
  }
  return bVar2;
}

Assistant:

static bool matched(const AffixPatternMatcher* affix, const UnicodeString& patternString) {
    return (affix == nullptr && patternString.isBogus()) ||
           (affix != nullptr && affix->getPattern() == patternString);
}